

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaCheckDerivationOKRestriction2to4
              (xmlSchemaParserCtxtPtr pctxt,int action,xmlSchemaBasicItemPtr item,
              xmlSchemaBasicItemPtr baseItem,xmlSchemaItemListPtr uses,xmlSchemaItemListPtr baseUses
              ,xmlSchemaWildcardPtr wild,xmlSchemaWildcardPtr baseWild)

{
  xmlSchemaAttributeUsePtr_conflict attruse;
  xmlSchemaAttributeUsePtr_conflict attruse_00;
  xmlSchemaAttributePtr pxVar1;
  xmlSchemaAttributePtr pxVar2;
  void *item_00;
  long lVar3;
  xmlSchemaParserCtxtPtr pxVar4;
  int iVar5;
  ulong uVar6;
  xmlNodePtr pxVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  xmlChar *str4;
  ulong uVar11;
  xmlSchemaBasicItemPtr pxVar12;
  xmlSchemaValPtr *val;
  xmlSchemaWildcardNsPtr pxVar13;
  xmlSchemaBasicItemPtr pxVar14;
  bool bVar15;
  xmlParserErrors xVar16;
  xmlSchemaWildcardNsPtr pxVar17;
  char *pcVar18;
  long lVar19;
  xmlChar *rEffValue;
  int effFixed;
  xmlChar *bEffValue;
  xmlChar *local_90;
  int local_84;
  xmlSchemaBasicItemPtr local_80;
  xmlChar *local_78;
  xmlSchemaBasicItemPtr local_70;
  xmlSchemaParserCtxtPtr local_68;
  int local_5c;
  xmlChar *local_58;
  xmlChar *local_50;
  xmlChar *local_48;
  xmlNodePtr local_40;
  xmlChar *local_38;
  
  local_84 = action;
  local_80 = item;
  local_70 = baseItem;
  local_68 = pctxt;
  if (uses != (xmlSchemaItemListPtr)0x0) {
    local_58 = "redefined";
    if (action == 0) {
      local_58 = "base";
    }
    for (lVar19 = 0; pxVar4 = local_68, pxVar12 = local_80, lVar19 < uses->nbItems;
        lVar19 = lVar19 + 1) {
      attruse = (xmlSchemaAttributeUsePtr_conflict)uses->items[lVar19];
      if (baseUses != (xmlSchemaItemListPtr)0x0) {
        uVar6 = (ulong)(uint)baseUses->nbItems;
        if (baseUses->nbItems < 1) {
          uVar6 = 0;
        }
        for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
          attruse_00 = (xmlSchemaAttributeUsePtr_conflict)baseUses->items[uVar11];
          pxVar1 = attruse->attrDecl;
          pxVar2 = attruse_00->attrDecl;
          if ((pxVar1->name == pxVar2->name) && (pxVar1->targetNamespace == pxVar2->targetNamespace)
             ) {
            if ((attruse->occurs == 2) && (attruse_00->occurs == 1)) {
              local_90 = (xmlChar *)0x0;
              pxVar7 = xmlSchemaGetComponentNode(local_80);
              pxVar8 = xmlSchemaGetComponentDesignation(&local_90,local_70);
              xVar16 = XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_1;
              pcVar18 = 
              "The \'optional\' attribute use is inconsistent with the corresponding \'required\' attribute use of the %s %s"
              ;
              goto LAB_001bea2c;
            }
            val = (xmlSchemaValPtr *)0x0;
            iVar5 = xmlSchemaCheckCOSSTDerivedOK
                              ((xmlSchemaAbstractCtxtPtr)local_68,pxVar1->subtypes,pxVar2->subtypes,
                               0);
            if (iVar5 == 0) {
              xmlSchemaGetEffectiveValueConstraint(attruse_00,&local_5c,&local_38,val);
              pxVar8 = local_38;
              if ((local_38 == (xmlChar *)0x0) || (local_5c != 1)) goto LAB_001bea44;
              local_90 = (xmlChar *)0x0;
              xmlSchemaGetEffectiveValueConstraint(attruse_00,&local_5c,&local_90,val);
              pxVar12 = local_80;
              if ((local_5c != 0) && (local_90 == pxVar8)) goto LAB_001bea44;
              local_78 = (xmlChar *)0x0;
              pxVar7 = xmlSchemaGetComponentNode(local_80);
              pxVar8 = xmlSchemaGetComponentDesignation(&local_78,local_70);
              xmlSchemaPAttrUseErr4
                        (local_68,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_3,pxVar7,pxVar12,attruse
                         ,
                         "The effective value constraint of the attribute use is inconsistent with its correspondent in the %s %s"
                         ,local_58,pxVar8,(xmlChar *)0x0,(xmlChar *)0x0);
              pxVar8 = local_78;
            }
            else {
              local_90 = (xmlChar *)0x0;
              local_78 = (xmlChar *)0x0;
              local_50 = (xmlChar *)0x0;
              local_40 = xmlSchemaGetComponentNode(local_80);
              local_48 = xmlSchemaGetComponentDesignation(&local_90,attruse->attrDecl->subtypes);
              pxVar8 = xmlSchemaGetComponentDesignation(&local_78,attruse_00->attrDecl->subtypes);
              pxVar9 = xmlSchemaGetComponentDesignation(&local_50,local_70);
              xmlSchemaPAttrUseErr4
                        (pxVar4,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_2,local_40,local_80,
                         attruse,
                         "The attribute declaration\'s %s is not validly derived from the corresponding %s of the attribute declaration in the %s %s"
                         ,local_48,pxVar8,local_58,pxVar9);
              if (local_90 != (xmlChar *)0x0) {
                (*xmlFree)(local_90);
              }
              pxVar8 = local_50;
              if (local_78 != (xmlChar *)0x0) {
                (*xmlFree)(local_78);
                pxVar8 = local_50;
              }
            }
            goto LAB_001bea36;
          }
        }
      }
      if ((baseWild == (xmlSchemaWildcardPtr)0x0) ||
         (iVar5 = xmlSchemaCheckCVCWildcardNamespace(baseWild,attruse->attrDecl->targetNamespace),
         iVar5 != 0)) {
        pxVar12 = local_80;
        local_90 = (xmlChar *)0x0;
        pxVar7 = xmlSchemaGetComponentNode(local_80);
        pxVar8 = xmlSchemaGetComponentDesignation(&local_90,local_70);
        xVar16 = XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_2;
        pcVar18 = "Neither a matching attribute use, nor a matching wildcard exists in the %s %s";
LAB_001bea2c:
        xmlSchemaPAttrUseErr4
                  (local_68,xVar16,pxVar7,pxVar12,attruse,pcVar18,local_58,pxVar8,(xmlChar *)0x0,
                   (xmlChar *)0x0);
        pxVar8 = local_90;
LAB_001bea36:
        if (pxVar8 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar8);
        }
      }
LAB_001bea44:
    }
  }
  if (baseUses != (xmlSchemaItemListPtr)0x0) {
    pxVar8 = "redefined";
    if (local_84 == 0) {
      pxVar8 = "base";
    }
    for (lVar19 = 0; lVar19 < baseUses->nbItems; lVar19 = lVar19 + 1) {
      item_00 = baseUses->items[lVar19];
      if (*(int *)((long)item_00 + 0x30) == 1) {
        if (uses != (xmlSchemaItemListPtr)0x0) {
          uVar6 = (ulong)(uint)uses->nbItems;
          if (uses->nbItems < 1) {
            uVar6 = 0;
          }
          for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
            lVar3 = *(long *)((long)uses->items[uVar11] + 0x18);
            if ((*(long *)(lVar3 + 0x10) == *(long *)(*(long *)((long)item_00 + 0x18) + 0x10)) &&
               (*(long *)(lVar3 + 0x70) == *(long *)(*(long *)((long)item_00 + 0x18) + 0x70)))
            goto LAB_001bed59;
          }
        }
        local_90 = (xmlChar *)0x0;
        local_78 = (xmlChar *)0x0;
        pxVar9 = xmlSchemaGetComponentDesignation(&local_90,item_00);
        pxVar10 = xmlSchemaGetComponentDesignation(&local_78,local_70);
        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)local_68,
                            XML_SCHEMAP_DERIVATION_OK_RESTRICTION_3,(xmlNodePtr)0x0,local_80,
                            "A matching attribute use for the \'required\' %s of the %s %s is missing"
                            ,pxVar9,pxVar8,pxVar10,(xmlChar *)0x0);
        if (local_90 != (xmlChar *)0x0) {
          (*xmlFree)(local_90);
        }
        if (local_78 != (xmlChar *)0x0) {
          (*xmlFree)(local_78);
        }
      }
LAB_001bed59:
    }
  }
  pxVar4 = local_68;
  pxVar14 = local_70;
  pxVar12 = local_80;
  if (wild == (xmlSchemaWildcardPtr)0x0) {
    return 0;
  }
  if (baseWild == (xmlSchemaWildcardPtr)0x0) {
    local_90 = (xmlChar *)0x0;
    pxVar8 = xmlSchemaGetComponentTypeStr(local_80);
    pxVar14 = local_70;
    pxVar9 = "redefined";
    if (local_84 == 0) {
      pxVar9 = "base";
    }
    pxVar10 = xmlSchemaGetComponentTypeStr(local_70);
    str4 = xmlSchemaGetComponentQName(&local_90,pxVar14);
    pxVar4 = local_68;
    xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)local_68,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_1
                        ,(xmlNodePtr)0x0,pxVar12,
                        "The %s has an attribute wildcard, but the %s %s \'%s\' does not have one",
                        pxVar8,pxVar9,pxVar10,str4);
    if (local_90 != (xmlChar *)0x0) {
      (*xmlFree)(local_90);
    }
    return pxVar4->err;
  }
  if ((baseWild->any != 0) ||
     (((wild->negNsSet != (xmlSchemaWildcardNsPtr)0x0 &&
       (baseWild->negNsSet != (xmlSchemaWildcardNsPtr)0x0)) &&
      (wild->negNsSet->value == baseWild->negNsSet->value)))) goto LAB_001bed9a;
  pxVar13 = wild->nsSet;
  if (pxVar13 == (xmlSchemaWildcardNsPtr)0x0) {
LAB_001bef30:
    local_90 = (xmlChar *)0x0;
    pxVar8 = "redefined";
    if (local_84 == 0) {
      pxVar8 = "base";
    }
    pxVar9 = xmlSchemaGetComponentTypeStr(local_70);
    pxVar10 = xmlSchemaGetComponentQName(&local_90,pxVar14);
    pcVar18 = "The attribute wildcard is not a valid subset of the wildcard in the %s %s \'%s\'";
    xVar16 = XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_2;
    pxVar14 = local_80;
  }
  else {
    if (baseWild->nsSet == (xmlSchemaWildcardNsPtr)0x0) {
      if (baseWild->negNsSet == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001bef30;
      for (; pxVar13 != (xmlSchemaWildcardNsPtr)0x0; pxVar13 = pxVar13->next) {
        if (pxVar13->value == baseWild->negNsSet->value) goto LAB_001bef30;
      }
    }
    else {
      bVar15 = false;
      for (; pxVar17 = (xmlSchemaWildcardNsPtr)&baseWild->nsSet,
          pxVar13 != (xmlSchemaWildcardNsPtr)0x0; pxVar13 = pxVar13->next) {
        do {
          pxVar17 = pxVar17->next;
          if (pxVar17 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001bef30;
        } while (pxVar13->value != pxVar17->value);
        bVar15 = true;
      }
      if (!bVar15) goto LAB_001bef30;
    }
LAB_001bed9a:
    if ((local_70->type == XML_SCHEMA_TYPE_BASIC) && (local_70[10].type == 0x2d)) {
      return 0;
    }
    if (baseWild->processContents <= wild->processContents) {
      return 0;
    }
    local_90 = (xmlChar *)0x0;
    pxVar8 = "redefined";
    if (local_84 == 0) {
      pxVar8 = "base";
    }
    pxVar9 = xmlSchemaGetComponentTypeStr(local_70);
    pxVar10 = xmlSchemaGetComponentQName(&local_90,pxVar14);
    pcVar18 = 
    "The {process contents} of the attribute wildcard is weaker than the one in the %s %s \'%s\'";
    xVar16 = XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_3;
  }
  xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pxVar4,xVar16,(xmlNodePtr)0x0,pxVar14,pcVar18,pxVar8
                      ,pxVar9,pxVar10,(xmlChar *)0x0);
  if (local_90 != (xmlChar *)0x0) {
    (*xmlFree)(local_90);
  }
  return pxVar4->err;
}

Assistant:

static int
xmlSchemaCheckDerivationOKRestriction2to4(xmlSchemaParserCtxtPtr pctxt,
				       int action,
				       xmlSchemaBasicItemPtr item,
				       xmlSchemaBasicItemPtr baseItem,
				       xmlSchemaItemListPtr uses,
				       xmlSchemaItemListPtr baseUses,
				       xmlSchemaWildcardPtr wild,
				       xmlSchemaWildcardPtr baseWild)
{
    xmlSchemaAttributeUsePtr cur = NULL, bcur;
    int i, j, found; /* err = 0; */
    const xmlChar *bEffValue;
    int effFixed;

    if (uses != NULL) {
	for (i = 0; i < uses->nbItems; i++) {
	    cur = uses->items[i];
	    found = 0;
	    if (baseUses == NULL)
		goto not_found;
	    for (j = 0; j < baseUses->nbItems; j++) {
		bcur = baseUses->items[j];
		if ((WXS_ATTRUSE_DECL_NAME(cur) ==
			WXS_ATTRUSE_DECL_NAME(bcur)) &&
		    (WXS_ATTRUSE_DECL_TNS(cur) ==
			WXS_ATTRUSE_DECL_TNS(bcur)))
		{
		    /*
		    * (2.1) "If there is an attribute use in the {attribute
		    * uses} of the {base type definition} (call this B) whose
		    * {attribute declaration} has the same {name} and {target
		    * namespace}, then  all of the following must be true:"
		    */
		    found = 1;

		    if ((cur->occurs == XML_SCHEMAS_ATTR_USE_OPTIONAL) &&
			(bcur->occurs == XML_SCHEMAS_ATTR_USE_REQUIRED))
		    {
			xmlChar *str = NULL;
			/*
			* (2.1.1) "one of the following must be true:"
			* (2.1.1.1) "B's {required} is false."
			* (2.1.1.2) "R's {required} is true."
			*/
			xmlSchemaPAttrUseErr4(pctxt,
			    XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_1,
			    WXS_ITEM_NODE(item), item, cur,
			    "The 'optional' attribute use is inconsistent "
			    "with the corresponding 'required' attribute use of "
			    "the %s %s",
			    WXS_ACTION_STR(action),
			    xmlSchemaGetComponentDesignation(&str, baseItem),
			    NULL, NULL);
			FREE_AND_NULL(str);
			/* err = pctxt->err; */
		    } else if (xmlSchemaCheckCOSSTDerivedOK(ACTXT_CAST pctxt,
			WXS_ATTRUSE_TYPEDEF(cur),
			WXS_ATTRUSE_TYPEDEF(bcur), 0) != 0)
		    {
			xmlChar *strA = NULL, *strB = NULL, *strC = NULL;

			/*
			* SPEC (2.1.2) "R's {attribute declaration}'s
			* {type definition} must be validly derived from
			* B's {type definition} given the empty set as
			* defined in Type Derivation OK (Simple) ($3.14.6)."
			*/
			xmlSchemaPAttrUseErr4(pctxt,
			    XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_2,
			    WXS_ITEM_NODE(item), item, cur,
			    "The attribute declaration's %s "
			    "is not validly derived from "
			    "the corresponding %s of the "
			    "attribute declaration in the %s %s",
			    xmlSchemaGetComponentDesignation(&strA,
				WXS_ATTRUSE_TYPEDEF(cur)),
			    xmlSchemaGetComponentDesignation(&strB,
				WXS_ATTRUSE_TYPEDEF(bcur)),
			    WXS_ACTION_STR(action),
			    xmlSchemaGetComponentDesignation(&strC, baseItem));
			    /* xmlSchemaGetComponentDesignation(&str, baseItem), */
			FREE_AND_NULL(strA);
			FREE_AND_NULL(strB);
			FREE_AND_NULL(strC);
			/* err = pctxt->err; */
		    } else {
			/*
			* 2.1.3 [Definition:]  Let the effective value
			* constraint of an attribute use be its {value
			* constraint}, if present, otherwise its {attribute
			* declaration}'s {value constraint} .
			*/
			xmlSchemaGetEffectiveValueConstraint(bcur,
			    &effFixed, &bEffValue, NULL);
			/*
			* 2.1.3 ... one of the following must be true
			*
			* 2.1.3.1 B's `effective value constraint` is
			* `absent` or default.
			*/
			if ((bEffValue != NULL) &&
			    (effFixed == 1)) {
			    const xmlChar *rEffValue = NULL;

			    xmlSchemaGetEffectiveValueConstraint(bcur,
				&effFixed, &rEffValue, NULL);
			    /*
			    * 2.1.3.2 R's `effective value constraint` is
			    * fixed with the same string as B's.
			    * MAYBE TODO: Compare the computed values.
			    *       Hmm, it says "same string" so
			    *       string-equality might really be sufficient.
			    */
			    if ((effFixed == 0) ||
				(! WXS_ARE_DEFAULT_STR_EQUAL(rEffValue, bEffValue)))
			    {
				xmlChar *str = NULL;

				xmlSchemaPAttrUseErr4(pctxt,
				    XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_3,
				    WXS_ITEM_NODE(item), item, cur,
				    "The effective value constraint of the "
				    "attribute use is inconsistent with "
				    "its correspondent in the %s %s",
				    WXS_ACTION_STR(action),
				    xmlSchemaGetComponentDesignation(&str,
					baseItem),
				    NULL, NULL);
				FREE_AND_NULL(str);
				/* err = pctxt->err; */
			    }
			}
		    }
		    break;
		}
	    }
not_found:
	    if (!found) {
		/*
		* (2.2) "otherwise the {base type definition} must have an
		* {attribute wildcard} and the {target namespace} of the
		* R's {attribute declaration} must be `valid` with respect
		* to that wildcard, as defined in Wildcard allows Namespace
		* Name ($3.10.4)."
		*/
		if ((baseWild == NULL) ||
		    (xmlSchemaCheckCVCWildcardNamespace(baseWild,
		    (WXS_ATTRUSE_DECL(cur))->targetNamespace) != 0))
		{
		    xmlChar *str = NULL;

		    xmlSchemaPAttrUseErr4(pctxt,
			XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_2,
			WXS_ITEM_NODE(item), item, cur,
			"Neither a matching attribute use, "
			"nor a matching wildcard exists in the %s %s",
			WXS_ACTION_STR(action),
			xmlSchemaGetComponentDesignation(&str, baseItem),
			NULL, NULL);
		    FREE_AND_NULL(str);
		    /* err = pctxt->err; */
		}
	    }
	}
    }
    /*
    * SPEC derivation-ok-restriction (3):
    * (3) "For each attribute use in the {attribute uses} of the {base type
    * definition} whose {required} is true, there must be an attribute
    * use with an {attribute declaration} with the same {name} and
    * {target namespace} as its {attribute declaration} in the {attribute
    * uses} of the complex type definition itself whose {required} is true.
    */
    if (baseUses != NULL) {
	for (j = 0; j < baseUses->nbItems; j++) {
	    bcur = baseUses->items[j];
	    if (bcur->occurs != XML_SCHEMAS_ATTR_USE_REQUIRED)
		continue;
	    found = 0;
	    if (uses != NULL) {
		for (i = 0; i < uses->nbItems; i++) {
		    cur = uses->items[i];
		    if ((WXS_ATTRUSE_DECL_NAME(cur) ==
			WXS_ATTRUSE_DECL_NAME(bcur)) &&
			(WXS_ATTRUSE_DECL_TNS(cur) ==
			WXS_ATTRUSE_DECL_TNS(bcur))) {
			found = 1;
			break;
		    }
		}
	    }
	    if (!found) {
		xmlChar *strA = NULL, *strB = NULL;

		xmlSchemaCustomErr4(ACTXT_CAST pctxt,
		    XML_SCHEMAP_DERIVATION_OK_RESTRICTION_3,
		    NULL, item,
		    "A matching attribute use for the "
		    "'required' %s of the %s %s is missing",
		    xmlSchemaGetComponentDesignation(&strA, bcur),
		    WXS_ACTION_STR(action),
		    xmlSchemaGetComponentDesignation(&strB, baseItem),
		    NULL);
		FREE_AND_NULL(strA);
		FREE_AND_NULL(strB);
	    }
	}
    }
    /*
    * derivation-ok-restriction (4)
    */
    if (wild != NULL) {
	/*
	* (4) "If there is an {attribute wildcard}, all of the
	* following must be true:"
	*/
	if (baseWild == NULL) {
	    xmlChar *str = NULL;

	    /*
	    * (4.1) "The {base type definition} must also have one."
	    */
	    xmlSchemaCustomErr4(ACTXT_CAST pctxt,
		XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_1,
		NULL, item,
		"The %s has an attribute wildcard, "
		"but the %s %s '%s' does not have one",
		WXS_ITEM_TYPE_NAME(item),
		WXS_ACTION_STR(action),
		WXS_ITEM_TYPE_NAME(baseItem),
		xmlSchemaGetComponentQName(&str, baseItem));
	    FREE_AND_NULL(str);
	    return(pctxt->err);
	} else if ((baseWild->any == 0) &&
		xmlSchemaCheckCOSNSSubset(wild, baseWild))
	{
	    xmlChar *str = NULL;
	    /*
	    * (4.2) "The complex type definition's {attribute wildcard}'s
	    * {namespace constraint} must be a subset of the {base type
	    * definition}'s {attribute wildcard}'s {namespace constraint},
	    * as defined by Wildcard Subset ($3.10.6)."
	    */
	    xmlSchemaCustomErr4(ACTXT_CAST pctxt,
		XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_2,
		NULL, item,
		"The attribute wildcard is not a valid "
		"subset of the wildcard in the %s %s '%s'",
		WXS_ACTION_STR(action),
		WXS_ITEM_TYPE_NAME(baseItem),
		xmlSchemaGetComponentQName(&str, baseItem),
		NULL);
	    FREE_AND_NULL(str);
	    return(pctxt->err);
	}
	/* 4.3 Unless the {base type definition} is the `ur-type
	* definition`, the complex type definition's {attribute
	* wildcard}'s {process contents} must be identical to or
	* stronger than the {base type definition}'s {attribute
	* wildcard}'s {process contents}, where strict is stronger
	* than lax is stronger than skip.
	*/
	if ((! WXS_IS_ANYTYPE(baseItem)) &&
	    (wild->processContents < baseWild->processContents)) {
	    xmlChar *str = NULL;
	    xmlSchemaCustomErr4(ACTXT_CAST pctxt,
		XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_3,
		NULL, baseItem,
		"The {process contents} of the attribute wildcard is "
		"weaker than the one in the %s %s '%s'",
		WXS_ACTION_STR(action),
		WXS_ITEM_TYPE_NAME(baseItem),
		xmlSchemaGetComponentQName(&str, baseItem),
		NULL);
	    FREE_AND_NULL(str)
		return(pctxt->err);
	}
    }
    return(0);
}